

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::FilenameToClassname(string *filename)

{
  ulong uVar1;
  char *pcVar2;
  undefined1 *puVar3;
  char *in_RSI;
  string *in_RDI;
  int i;
  int lastindex;
  string *result;
  undefined4 local_1c;
  
  std::__cxx11::string::find_last_of(in_RSI,0x770a7b);
  std::__cxx11::string::substr((ulong)in_RDI,(ulong)in_RSI);
  for (local_1c = 0; uVar1 = std::__cxx11::string::size(), (ulong)(long)local_1c < uVar1;
      local_1c = local_1c + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    if (*pcVar2 == '/') {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar3 = 0x5c;
    }
  }
  return in_RDI;
}

Assistant:

std::string FilenameToClassname(const string& filename) {
  int lastindex = filename.find_last_of(".");
  std::string result = filename.substr(0, lastindex);
  for (int i = 0; i < result.size(); i++) {
    if (result[i] == '/') {
      result[i] = '\\';
    }
  }
  return result;
}